

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.h
# Opt level: O2

void __thiscall VmConstant::~VmConstant(VmConstant *this)

{
  VmValue::~VmValue(&this->super_VmValue);
  operator_delete(this,0xd8);
  return;
}

Assistant:

VmConstant(Allocator *allocator, VmType type, SynBase *source): VmValue(myTypeID, allocator, type, source)
	{
		iValue = 0;
		dValue = 0.0;
		lValue = 0ll;
		sValue = NULL;
		bValue = NULL;
		fValue = NULL;

		container = NULL;

		isFloat = false;
		isReference = false;
	}